

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array-left-rotation.cpp
# Opt level: O2

void rotate(vector<int,_std::allocator<int>_> *xs,int shift)

{
  pointer __dest;
  pointer piVar1;
  size_t __n;
  size_type __n_00;
  vector<int,_std::allocator<int>_> ys;
  allocator_type local_29;
  _Vector_base<int,_std::allocator<int>_> local_28;
  
  __n_00 = (size_type)shift;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_28,__n_00,&local_29);
  if (shift != 0) {
    memmove(local_28._M_impl.super__Vector_impl_data._M_start,
            (xs->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start,__n_00 * 4);
  }
  __dest = (xs->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar1 = __dest + __n_00;
  __n = (long)(xs->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
              _M_finish - (long)piVar1;
  if (__n != 0) {
    memmove(__dest,piVar1,__n);
  }
  if ((long)local_28._M_impl.super__Vector_impl_data._M_finish -
      (long)local_28._M_impl.super__Vector_impl_data._M_start != 0) {
    piVar1 = (xs->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    memmove(piVar1 + (((ulong)((long)(xs->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                     super__Vector_impl_data._M_finish - (long)piVar1) >> 2) -
                     __n_00),local_28._M_impl.super__Vector_impl_data._M_start,
            (long)local_28._M_impl.super__Vector_impl_data._M_finish -
            (long)local_28._M_impl.super__Vector_impl_data._M_start);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_28);
  return;
}

Assistant:

void rotate(std::vector<int> &xs, const int shift) {
  std::vector<int> ys(shift);
  std::copy(xs.cbegin(), xs.cbegin() + shift, ys.begin());
  std::copy(xs.cbegin() + shift, xs.cend(), xs.begin());
  std::copy(ys.cbegin(), ys.cend(), xs.begin() + (xs.size() - shift));
}